

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall
ON_BinaryArchive::EndRead3dmChunk(ON_BinaryArchive *this,bool bSupressPartiallyReadChunkWarning)

{
  uint *puVar1;
  ON__UINT32 OVar2;
  ulong uVar3;
  ON_3dmTableStatusLink *pOVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint version_number;
  long lVar8;
  size_t sVar9;
  ON_3DM_BIG_CHUNK *pOVar10;
  char *pcVar11;
  ulong uVar12;
  int iVar13;
  undefined7 in_register_00000031;
  uint uVar14;
  uint uVar15;
  ulong bytes_from_start;
  uchar two_crc_bytes [2];
  uint app_date;
  uint app_month;
  uint app_year;
  uint app_major_version;
  uint file_major_version;
  uint file_date;
  uint file_month;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  undefined4 local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  bVar5 = ReadMode(this);
  if (!bVar5) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x1949,"","ReadMode() = false.");
    return false;
  }
  lVar8 = (long)(this->m_chunk).m_count;
  pOVar10 = (this->m_chunk).m_a;
  if (pOVar10 + lVar8 + -1 == (ON_3DM_BIG_CHUNK *)0x0 || lVar8 < 1) {
    return false;
  }
  local_54 = (undefined4)CONCAT71(in_register_00000031,bSupressPartiallyReadChunkWarning);
  uVar12 = this->m_current_positionX;
  bytes_from_start = pOVar10[lVar8 + -1].m_start_offset;
  bVar5 = true;
  if (pOVar10[lVar8 + -1].m_bLongChunk != '\0') {
    if (pOVar10[lVar8 + -1].m_big_value < 0) {
      this->m_critical_error_count = this->m_critical_error_count + 1;
      pOVar4 = this->m_3dm_table_status_list;
      if ((pOVar4 != (ON_3dmTableStatusLink *)0x0) &&
         (this->m_3dm_active_table == (pOVar4->m_table_status).m_table_type)) {
        puVar1 = &(pOVar4->m_table_status).m_critical_error_count;
        *puVar1 = *puVar1 + 1;
      }
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x1959,"","ON_BinaryArchive::EndRead3dmChunk - negative chunk length");
      if (pOVar10[lVar8 + -1].m_bLongChunk == '\0') goto LAB_00393584;
    }
    else {
      bytes_from_start = bytes_from_start + pOVar10[lVar8 + -1].m_big_value;
    }
    bVar6 = this->m_bChunkBoundaryCheck;
    if (pOVar10[lVar8 + -1].m_do_crc16 == '\0') {
      if ((pOVar10[lVar8 + -1].m_do_crc32 != '\0') && (uVar12 + 4 == bytes_from_start)) {
        OVar2 = pOVar10[lVar8 + -1].m_crc32;
        this->m_bChunkBoundaryCheck = false;
        bVar5 = ReadInt32(this,1,(ON__INT32 *)&local_64);
        this->m_bChunkBoundaryCheck = bVar6;
        if ((bVar5) && (uVar12 = bytes_from_start, local_64 != OVar2)) {
          Internal_ReportCRCError(this);
          pcVar11 = "ON_BinaryArchive::EndRead3dmChunk: CRC32 error.";
          iVar13 = 0x198d;
          goto LAB_0039357a;
        }
      }
    }
    else if (uVar12 + 2 == bytes_from_start) {
      local_64 = local_64 & 0xffff0000;
      this->m_bChunkBoundaryCheck = false;
      sVar9 = Read(this,2,&local_64);
      this->m_bChunkBoundaryCheck = bVar6;
      bVar5 = sVar9 == 2;
      if ((bVar5) && (uVar12 = bytes_from_start, pOVar10[lVar8 + -1].m_crc16 != 0)) {
        Internal_ReportCRCError(this);
        pcVar11 = "ON_BinaryArchive::EndRead3dmChunk: CRC16 error.";
        iVar13 = 0x1973;
LAB_0039357a:
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,iVar13,"",pcVar11);
        uVar12 = bytes_from_start;
      }
    }
  }
LAB_00393584:
  uVar3 = pOVar10[lVar8 + -1].m_start_offset;
  if (uVar12 < uVar3) {
    this->m_critical_error_count = this->m_critical_error_count + 1;
    pOVar4 = this->m_3dm_table_status_list;
    if ((pOVar4 != (ON_3dmTableStatusLink *)0x0) &&
       (this->m_3dm_active_table == (pOVar4->m_table_status).m_table_type)) {
      puVar1 = &(pOVar4->m_table_status).m_critical_error_count;
      *puVar1 = *puVar1 + 1;
    }
    pcVar11 = "ON_BinaryArchive::EndRead3dmChunk: current position before start of current chunk.";
    iVar13 = 0x19a6;
  }
  else {
    if (uVar12 <= bytes_from_start) {
      if (bytes_from_start != uVar12) {
        local_38 = bytes_from_start;
        if ((uVar12 != uVar3) &&
           ((this->m_3dm_version != 1 || ((this->m_error_message_mask & 2) == 0)))) {
          uVar14 = 0;
          local_64 = 0;
          local_44 = 0;
          local_48 = 0;
          local_4c = 0;
          local_40 = uVar12;
          bVar6 = ON_VersionNumberParse
                            (this->m_3dm_opennurbs_version,&local_4c,(uint *)0x0,&local_64,&local_44
                             ,&local_48,(uint *)0x0);
          uVar15 = 0;
          if (bVar6) {
            uVar15 = (local_64 * 100 + local_44) * 100 + local_48;
          }
          local_58 = 0;
          local_5c = 0;
          local_60 = 0;
          local_50 = 0;
          version_number = ON::Version();
          bVar6 = ON_VersionNumberParse
                            (version_number,&local_50,(uint *)0x0,&local_58,&local_5c,&local_60,
                             (uint *)0x0);
          if (bVar6) {
            uVar14 = (local_58 * 100 + local_5c) * 100 + local_60;
          }
          uVar12 = local_40;
          if ((uVar15 <= uVar14 && (char)local_54 == '\0') && local_4c <= local_50) {
            ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                         ,0x19ed,"",
                         "ON_BinaryArchive::EndRead3dmChunk: partially read chunk - skipping bytes at end of current chunk."
                        );
            uVar12 = local_40;
          }
        }
        bVar6 = this->m_bChunkBoundaryCheck;
        this->m_bChunkBoundaryCheck = false;
        if (uVar12 <= local_38 && local_38 - uVar12 != 0) {
          bVar7 = Internal_SeekCur(this,true,local_38 - uVar12);
          bVar5 = (bool)(bVar7 & bVar5);
        }
        this->m_bChunkBoundaryCheck = bVar6;
      }
      goto LAB_00393613;
    }
    this->m_critical_error_count = this->m_critical_error_count + 1;
    pOVar4 = this->m_3dm_table_status_list;
    if ((pOVar4 != (ON_3dmTableStatusLink *)0x0) &&
       (this->m_3dm_active_table == (pOVar4->m_table_status).m_table_type)) {
      puVar1 = &(pOVar4->m_table_status).m_critical_error_count;
      *puVar1 = *puVar1 + 1;
    }
    pcVar11 = "ON_BinaryArchive::EndRead3dmChunk: current position after end of current chunk.";
    iVar13 = 0x19ad;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,iVar13,"",pcVar11);
  bVar6 = SeekFromStart(this,bytes_from_start);
  bVar5 = (bool)(bVar5 & bVar6);
LAB_00393613:
  (*(this->m_chunk)._vptr_ON_SimpleArray[2])(&this->m_chunk,(ulong)((this->m_chunk).m_count - 1));
  lVar8 = (long)(this->m_chunk).m_count;
  pOVar10 = (this->m_chunk).m_a + lVar8;
  if (pOVar10 == (ON_3DM_BIG_CHUNK *)0x28 || lVar8 < 1) {
    bVar6 = false;
  }
  else {
    bVar6 = true;
    if (pOVar10[-1].m_do_crc16 == '\0') {
      bVar6 = pOVar10[-1].m_do_crc32 != '\0';
    }
  }
  this->m_bDoChunkCRC = bVar6;
  return bVar5;
}

Assistant:

bool ON_BinaryArchive::EndRead3dmChunk(bool bSupressPartiallyReadChunkWarning)  
{
  if (false == ReadMode())
  {
    ON_ERROR("ReadMode() = false.");
    return false;
  }

  //int length = 0;
  bool rc = false;
  ON_3DM_BIG_CHUNK* c = m_chunk.Last();
  if ( c ) 
  {
    ON__UINT64 file_offset = CurrentPosition();
    ON__UINT64 end_offset = c->m_start_offset;
    if ( c->m_bLongChunk )
    {
      if ( c->m_big_value < 0 )
      {
        Internal_ReportCriticalError();
        ON_ERROR("ON_BinaryArchive::EndRead3dmChunk - negative chunk length");
      }
      else
      {
        end_offset += ((ON__UINT64)c->m_big_value);
      }
    }

    if ( c->m_bLongChunk ) 
    {
      const bool bChunkBoundaryCheck = m_bChunkBoundaryCheck;
      if ( c->m_do_crc16 ) 
      {
        if ( file_offset+2 == end_offset )
        {
          // read 16 bit CRC
          unsigned char two_crc_bytes[2] = {0,0};
          m_bChunkBoundaryCheck = false;
          rc = ReadByte( 2, two_crc_bytes );
          m_bChunkBoundaryCheck = bChunkBoundaryCheck;
          if (rc) 
          {
            file_offset+=2;
            if (c->m_crc16) 
            {
              Internal_ReportCRCError();
              ON_ERROR("ON_BinaryArchive::EndRead3dmChunk: CRC16 error.");
            }
          }
        }
        else
        {
          // partially read chunk - crc check not possible.
          rc = true;
        }
      }
      else if ( c->m_do_crc32 ) 
      {
        if ( file_offset+4 == end_offset )
        {
          // read 32 bit CRC
          ON__UINT32 crc1 = c->m_crc32;
          ON__UINT32 crc0;
          m_bChunkBoundaryCheck = false;
          rc = ReadInt32( 1, (ON__INT32*)&crc0 );
          m_bChunkBoundaryCheck = bChunkBoundaryCheck;
          if (rc) 
          {
            file_offset+=4;
            if (crc0 != crc1) 
            {
              Internal_ReportCRCError();
              ON_ERROR("ON_BinaryArchive::EndRead3dmChunk: CRC32 error.");
            }
          }
        }
        else
        {
          // partially read chunk - crc check not possible.
          rc = true;
        }
      }
      else 
      {
        // no crc in this chunk
        rc = true;
      }
    }
    else 
    {
      rc = true;
    }

    // check length and seek to end of chunk if things are amiss
    if ( file_offset < c->m_start_offset ) 
    {
      Internal_ReportCriticalError();
      ON_ERROR("ON_BinaryArchive::EndRead3dmChunk: current position before start of current chunk.");
      if ( !SeekFromStart( end_offset ) )
        rc = false;
    }
    else if ( file_offset > end_offset ) 
    {
      Internal_ReportCriticalError();
      ON_ERROR("ON_BinaryArchive::EndRead3dmChunk: current position after end of current chunk.");
      if ( !SeekFromStart( end_offset ) )
        rc = false;
    }
    else if ( file_offset != end_offset ) 
    {
      // partially read chunk - happens when chunks are skipped or old code
      // reads a new minor version of a chunk whnich has added information.
      if ( file_offset != c->m_start_offset ) 
      {
        if ( m_3dm_version != 1 || (m_error_message_mask&0x02) == 0 ) 
        {
          // when reading v1 files, there are some situations where
          // it is reasonable to attempt to read 4 bytes at the end
          // of a file.  The above test prevents making a call
          // to ON_WARNING() in these situations.

          unsigned int file_year = 0;
          unsigned int file_month = 0;
          unsigned int file_date = 0;
          unsigned int file_major_version = 0;
          const bool bHaveFileDate = ON_VersionNumberParse(
            m_3dm_opennurbs_version,
            &file_major_version,
            0,
            &file_year,
            &file_month,
            &file_date,
            0
            );

          const unsigned int file_ymd
            = bHaveFileDate
            ? ((file_year * 100 + file_month) * 100 + file_date)
            : 0;

          unsigned int app_year = 0;
          unsigned int app_month = 0;
          unsigned int app_date = 0;
          unsigned int app_major_version = 0;
          const bool bHaveAppDate = ON_VersionNumberParse(
            ON::Version(),
            &app_major_version,
            0,
            &app_year,
            &app_month,
            &app_date,
            0
            );

          const unsigned int app_ymd
            = bHaveAppDate
            ? ((app_year * 100 + app_month) * 100 + app_date)
            : 0;

          if (file_major_version <= app_major_version 
            && file_ymd <= app_ymd
            )
          {
            // We are reading a file written by this version or an
            // earlier version of opennurbs.  
            // There should not be any partially read chunks.
            if (!bSupressPartiallyReadChunkWarning)
            {
              ON_WARNING("ON_BinaryArchive::EndRead3dmChunk: partially read chunk - skipping bytes at end of current chunk.");
            }
          }
        }
      }

      const bool bChunkBoundaryCheck = m_bChunkBoundaryCheck;
      m_bChunkBoundaryCheck = false;
      if ( end_offset > file_offset )
      {
        if ( !SeekForward(end_offset - file_offset) )
          rc = false;
      }
      else if ( end_offset < file_offset )
      {
        if ( !SeekBackward(file_offset - end_offset) )
          rc = false;
      }
      m_bChunkBoundaryCheck = bChunkBoundaryCheck;

    }

    m_chunk.Remove();
    c = m_chunk.Last();
    m_bDoChunkCRC = (c && (c->m_do_crc16 || c->m_do_crc32));
  }
  return rc;
}